

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intraprocess_publisher_link.cpp
# Opt level: O2

void __thiscall miniros::IntraProcessPublisherLink::drop(IntraProcessPublisherLink *this)

{
  recursive_mutex *__mutex;
  element_type *peVar1;
  Level level;
  void *logger_handle;
  string *psVar2;
  allocator<char> local_51;
  SubscriptionPtr parent;
  string local_40;
  
  __mutex = &this->drop_mutex_;
  std::recursive_mutex::lock(__mutex);
  if (this->dropped_ != false) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  this->dropped_ = true;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  peVar1 = (this->publisher_).
           super___shared_ptr<miniros::IntraProcessSubscriberLink,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (*(peVar1->super_SubscriberLink)._vptr_SubscriberLink[3])();
    std::__shared_ptr<miniros::IntraProcessSubscriberLink,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->publisher_).
                super___shared_ptr<miniros::IntraProcessSubscriberLink,_(__gnu_cxx::_Lock_policy)2>)
    ;
  }
  std::__shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&parent.super___shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>);
  if (parent.super___shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (drop::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"miniros.intraprocess_publisher_link",&local_51);
      console::initializeLogLocation(&drop::loc,&local_40,Debug);
      std::__cxx11::string::~string((string *)&local_40);
    }
    if (drop::loc.level_ != Debug) {
      console::setLogLocationLevel(&drop::loc,Debug);
      console::checkLogLocationEnabled(&drop::loc);
    }
    logger_handle = drop::loc.logger_;
    level = drop::loc.level_;
    if (drop::loc.logger_enabled_ == true) {
      psVar2 = Subscription::getName_abi_cxx11_
                         (parent.
                          super___shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
      console::print((FilterBase *)0x0,logger_handle,level,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/intraprocess_publisher_link.cpp"
                     ,0x65,"virtual void miniros::IntraProcessPublisherLink::drop()",
                     "Connection to local publisher on topic [%s] dropped",
                     (psVar2->_M_dataplus)._M_p);
    }
    std::__shared_ptr<miniros::PublisherLink,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<miniros::PublisherLink,void>
              ((__shared_ptr<miniros::PublisherLink,(__gnu_cxx::_Lock_policy)2> *)&local_40,
               (__weak_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_PublisherLink).super_enable_shared_from_this<miniros::PublisherLink>);
    Subscription::removePublisherLink
              (parent.super___shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (PublisherLinkPtr *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parent.super___shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void IntraProcessPublisherLink::drop()
{
  {
    std::scoped_lock<std::recursive_mutex> lock(drop_mutex_);
    if (dropped_)
    {
      return;
    }

    dropped_ = true;
  }

  if (publisher_)
  {
    publisher_->drop();
    publisher_.reset();
  }

  if (SubscriptionPtr parent = parent_.lock())
  {
    MINIROS_DEBUG("Connection to local publisher on topic [%s] dropped", parent->getName().c_str());

    parent->removePublisherLink(shared_from_this());
  }
}